

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O2

void * customrecalloc(void *p,size_t num,size_t sz)

{
  void *pvVar1;
  
  pvVar1 = customrealloc(p,num * sz);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,num * sz);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void * MYCDECL CUSTOM_RECALLOC (void * p, size_t num, size_t sz)
{
  auto n = num * sz;
  void * ptr = CUSTOM_REALLOC (p, n);
  if (ptr) {
    // Clear out the memory.
    memset (ptr, 0, n);
  }
  return ptr;
}